

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O1

IntrinsicResult MiniScript::intrinsic_floor(Context *context,IntrinsicResult partialResult)

{
  long *plVar1;
  undefined2 *puVar2;
  Value x;
  long *local_60;
  char local_58;
  undefined1 local_50 [16];
  Value local_40 [2];
  
  local_58 = '\0';
  plVar1 = (long *)operator_new(0x30);
  plVar1[1] = 1;
  *plVar1 = (long)&PTR__StringStorage_001d10b0;
  plVar1[3] = 2;
  plVar1[4] = -1;
  puVar2 = (undefined2 *)operator_new__(2);
  plVar1[2] = (long)puVar2;
  *puVar2 = 0;
  *puVar2 = 0x78;
  local_60 = plVar1;
  Context::GetVar((Context *)local_50,(String *)partialResult.rs,(LocalOnlyMode)&local_60);
  if ((local_60 != (long *)0x0) && (local_58 == '\0')) {
    plVar1 = local_60 + 1;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (**(code **)(*local_60 + 8))();
    }
    local_60 = (long *)0x0;
  }
  plVar1 = (long *)local_50._8_8_;
  if (local_50[0] != 1) {
    plVar1 = (long *)0x0;
  }
  local_40[0].data.number = floor((double)plVar1);
  local_40[0].type = Number;
  local_40[0].noInvoke = false;
  local_40[0].localOnly = Off;
  (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
  IntrinsicResult::ensureStorage((IntrinsicResult *)context);
  Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                   local_40);
  *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
  if ((Temp < local_40[0].type) && (local_40[0].data.ref != (RefCountedStorage *)0x0)) {
    plVar1 = &(local_40[0].data.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_40[0].data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_40[0].data.number = 0.0;
  }
  if ((2 < local_50[0]) && ((long *)local_50._8_8_ != (long *)0x0)) {
    plVar1 = (long *)(local_50._8_8_ + 8);
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (**(code **)(*(long *)local_50._8_8_ + 8))();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_floor(Context *context, IntrinsicResult partialResult) {
		Value x = context->GetVar("x");
		return IntrinsicResult(floor(x.DoubleValue()));
	}